

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

Log * Scine::Core::Log::silent(void)

{
  Log *in_RDI;
  
  memset(in_RDI,0,0x38);
  Domain::Domain((Domain *)0x11e5ec);
  memset(&in_RDI->warning,0,0x38);
  Domain::Domain((Domain *)0x11e610);
  memset(&in_RDI->error,0,0x38);
  Domain::Domain((Domain *)0x11e634);
  memset(&in_RDI->output,0,0x38);
  Domain::Domain((Domain *)0x11e65b);
  return in_RDI;
}

Assistant:

static inline Log silent() {
    return Log{Domain(), Domain(), Domain(), Domain()};
  }